

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O3

int getESICnt(string *esiStr)

{
  istream *piVar1;
  int iVar2;
  string num;
  istringstream ss;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)esiStr,_S_in);
  local_1b8 = 0;
  local_1b0 = 0;
  iVar2 = 0;
  local_1c0 = &local_1b0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)&local_1c0,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    iVar2 = iVar2 + 1;
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  return iVar2;
}

Assistant:

int getESICnt (string esiStr) {

    istringstream ss(esiStr);
    int esiCnt = 0;
    string num;
    while (getline(ss, num, ',')) {
        esiCnt++;
    }

    return esiCnt;

}